

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O0

bool absl::lts_20250127::str_format_internal::FormatConversionCharIsFloat(FormatConversionChar c)

{
  undefined1 local_9;
  FormatConversionChar c_local;
  
  if (((((c == 0xe) || (c == 10)) || (c == 8)) || ((c == 0xc || (c == 0xf)))) ||
     ((c == 0xb || ((c == 9 || (c == 0xd)))))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

inline bool FormatConversionCharIsFloat(FormatConversionChar c) {
  if (c == FormatConversionCharInternal::a ||
      c == FormatConversionCharInternal::e ||
      c == FormatConversionCharInternal::f ||
      c == FormatConversionCharInternal::g ||
      c == FormatConversionCharInternal::A ||
      c == FormatConversionCharInternal::E ||
      c == FormatConversionCharInternal::F ||
      c == FormatConversionCharInternal::G) {
    return true;
  } else {
    return false;
  }
}